

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

void __thiscall pg::Game::permute(Game *this,int *mapping)

{
  int local_1c;
  int i;
  int *mapping_local;
  Game *this_local;
  
  unsafe_permute(this,mapping);
  this->is_ordered = true;
  local_1c = 1;
  while( true ) {
    if (this->n_vertices <= (long)local_1c) {
      return;
    }
    if (this->_priority[local_1c] < this->_priority[local_1c + -1]) break;
    local_1c = local_1c + 1;
  }
  this->is_ordered = false;
  return;
}

Assistant:

void
Game::permute(int *mapping)
{
    unsafe_permute(mapping);

    // check if ordered...
    is_ordered = true;
    for (int i=1; i<n_vertices; i++) {
        if (_priority[i-1] > _priority[i]) {
            is_ordered = false;
            break;
        }
    }
}